

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.cpp
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::appendInst
          (BuilderContext *this,BBLIter bblIter,shared_ptr<mocker::ir::IRInst> *inst)

{
  element_type *this_00;
  mapped_type *pmVar1;
  pointer this_01;
  shared_ptr<mocker::ir::IRInst> local_38;
  InstID local_28;
  shared_ptr<mocker::ir::IRInst> *local_20;
  shared_ptr<mocker::ir::IRInst> *inst_local;
  BuilderContext *this_local;
  BBLIter bblIter_local;
  
  local_20 = inst;
  inst_local = (shared_ptr<mocker::ir::IRInst> *)this;
  this_local = (BuilderContext *)bblIter._M_node;
  this_00 = std::__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)inst);
  local_28 = IRInst::getID(this_00);
  pmVar1 = std::
           unordered_map<unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>_>_>_>
           ::operator[](&this->bbReside,&local_28);
  pmVar1->_M_node = (_List_node_base *)this_local;
  this_01 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                      ((_List_iterator<mocker::ir::BasicBlock> *)&this_local);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr(&local_38,inst);
  BasicBlock::appendInst(this_01,&local_38);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_38);
  return;
}

Assistant:

void BuilderContext::appendInst(BBLIter bblIter, std::shared_ptr<IRInst> inst) {
  bbReside[inst->getID()] = bblIter;
  bblIter->appendInst(std::move(inst));
}